

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O3

LYD_FORMAT detect_data_format(char *filepath)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  ushort **ppuVar5;
  
  uVar4 = strlen(filepath);
  ppuVar5 = __ctype_b_loc();
  bVar1 = *(byte *)((long)*ppuVar5 + (long)filepath[uVar4 - 1] * 2 + 1);
  while ((bVar1 & 0x20) != 0) {
    filepath[uVar4 - 1] = '\0';
    lVar2 = uVar4 - 2;
    uVar4 = uVar4 - 1;
    bVar1 = *(byte *)((long)*ppuVar5 + (long)filepath[lVar2] * 2 + 1);
  }
  if (4 < uVar4) {
    iVar3 = strcmp(filepath + (uVar4 - 4),".xml");
    if (iVar3 == 0) {
      return LYD_XML;
    }
    if ((uVar4 != 5) && (iVar3 = strcmp(filepath + (uVar4 - 5),".json"), iVar3 == 0)) {
      return LYD_JSON;
    }
    iVar3 = strcmp(filepath + (uVar4 - 4),".lyb");
    if (iVar3 == 0) {
      return LYD_LYB;
    }
  }
  return LYD_UNKNOWN;
}

Assistant:

static LYD_FORMAT
detect_data_format(char *filepath)
{
    size_t len;

    /* detect input format according to file suffix */
    len = strlen(filepath);
    for (; isspace(filepath[len - 1]); len--, filepath[len] = '\0'); /* remove trailing whitespaces */
    if (len >= 5 && !strcmp(&filepath[len - 4], ".xml")) {
        return LYD_XML;
    } else if (len >= 6 && !strcmp(&filepath[len - 5], ".json")) {
        return LYD_JSON;
    } else if (len >= 5 && !strcmp(&filepath[len - 4], ".lyb")) {
        return LYD_LYB;
    } else {
        return LYD_UNKNOWN;
    }
}